

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O3

bool Rml::ElementUtilities::PositionElement(Element *element,Vector2f offset,PositionAnchor anchor)

{
  Vector2f VVar1;
  Vector2f VVar2;
  Element *this;
  Box *this_00;
  ElementScroll *pEVar3;
  float fVar4;
  float fVar5;
  Box box;
  Vector2f local_98;
  float local_88;
  float fStack_84;
  Box local_60;
  
  this = Element::GetParentNode(element);
  if (this != (Element *)0x0) {
    this_00 = Element::GetBox(this);
    VVar1 = Box::GetSize(this_00);
    pEVar3 = Element::GetElementScroll(this);
    fVar4 = ElementScroll::GetScrollbarSize(pEVar3,VERTICAL);
    pEVar3 = Element::GetElementScroll(this);
    fVar5 = ElementScroll::GetScrollbarSize(pEVar3,HORIZONTAL);
    local_98.x = VVar1.x;
    local_98.y = VVar1.y;
    local_98.x = local_98.x - fVar4;
    local_98.y = local_98.y - fVar5;
    Box::Box(&local_60);
    LayoutDetails::BuildBox(&local_60,local_98,element,Block);
    VVar1 = Box::GetSize(&local_60);
    if (VVar1.y < 0.0) {
      VVar2 = Box::GetSize(&local_60);
      VVar1.y = local_98.y;
      VVar1.x = VVar2.x;
      Box::SetContent(&local_60,VVar1);
    }
    Element::SetBox(element,&local_60);
    VVar1 = Box::GetSize(&local_60,Margin);
    local_88 = offset.x;
    fStack_84 = offset.y;
    if ((anchor & RIGHT) != 0) {
      local_88 = local_98.x - (VVar1.x + local_88);
    }
    if ((anchor & BOTTOM) != 0) {
      fStack_84 = local_98.y - (VVar1.y + fStack_84);
    }
    VVar1 = Box::GetPosition(this_00,Content);
    fVar4 = Box::GetEdge(&local_60,Margin,Left);
    fVar5 = Box::GetEdge(&local_60,Margin,Top);
    local_98.x = VVar1.x;
    local_98.y = VVar1.y;
    VVar2.y = fVar5 + fStack_84 + local_98.y;
    VVar2.x = fVar4 + local_88 + local_98.x;
    Element::SetOffset(element,VVar2,this,false);
    Box::~Box(&local_60);
  }
  return this != (Element *)0x0;
}

Assistant:

bool ElementUtilities::PositionElement(Element* element, Vector2f offset, PositionAnchor anchor)
{
	Element* parent = element->GetParentNode();
	if (!parent)
		return false;

	const Box& parent_box = parent->GetBox();
	Vector2f containing_block = parent_box.GetSize();
	containing_block.x -= parent->GetElementScroll()->GetScrollbarSize(ElementScroll::VERTICAL);
	containing_block.y -= parent->GetElementScroll()->GetScrollbarSize(ElementScroll::HORIZONTAL);

	Box box;
	LayoutDetails::BuildBox(box, containing_block, element);
	if (box.GetSize().y < 0.f)
		box.SetContent(Vector2f(box.GetSize().x, containing_block.y));
	element->SetBox(box);

	Vector2f element_block = box.GetSize(BoxArea::Margin);
	Vector2f resolved_offset = offset;

	if (anchor & RIGHT)
		resolved_offset.x = containing_block.x - (element_block.x + offset.x);
	if (anchor & BOTTOM)
		resolved_offset.y = containing_block.y - (element_block.y + offset.y);

	// Position element relative to its parent.
	Vector2f relative_offset = parent_box.GetPosition(BoxArea::Content);
	relative_offset += resolved_offset;
	relative_offset.x += box.GetEdge(BoxArea::Margin, BoxEdge::Left);
	relative_offset.y += box.GetEdge(BoxArea::Margin, BoxEdge::Top);

	element->SetOffset(relative_offset, parent);

	return true;
}